

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

void add_objunit(GlobalVars *gv,ObjectUnit *ou,bool fixrelocs)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  node *pnVar4;
  byte bVar5;
  node *pnVar6;
  char *pcVar7;
  list *l;
  node *pnVar8;
  node *pnVar9;
  
  if (ou == (ObjectUnit *)0x0) {
    return;
  }
  bVar1 = ou->lnkfile->type;
  bVar5 = bVar1;
  if ((bVar1 == 8) && (bVar5 = 1, gv->whole_archive == 0)) {
    bVar5 = bVar1;
  }
  if (bVar5 - 1 < 2) {
    *(byte *)&ou->flags = (byte)ou->flags | 1;
    l = &gv->selobjects;
  }
  else if (bVar5 == 4) {
    l = &gv->sharedobjects;
  }
  else {
    if (bVar5 != 8) {
      ierror("add_objunit(): Link File type = %d");
      goto LAB_0011070d;
    }
    l = &gv->libobjects;
  }
  addtail(l,&ou->n);
LAB_0011070d:
  if (fixrelocs != 0) {
    for (pnVar8 = (ou->sections).first; pnVar8->next != (node *)0x0; pnVar8 = pnVar8->next) {
      for (pnVar9 = pnVar8[6].next; pnVar9->next != (node *)0x0; pnVar9 = pnVar9->next) {
        uVar2 = *(uint *)&pnVar9[1].pred;
        pnVar4 = (ou->sections).first;
        do {
          pnVar6 = pnVar4;
          if (pnVar6->next == (node *)0x0) {
            pnVar6 = (node *)0x0;
            break;
          }
          pnVar4 = pnVar6->next;
        } while (*(uint *)&pnVar6[2].pred != uVar2);
        pnVar9[1].pred = pnVar6;
        if (pnVar6 == (node *)0x0) {
          pcVar3 = ou->lnkfile->pathname;
          pnVar4 = pnVar8[2].next;
          pcVar7 = getobjname(ou);
          error(0x34,pcVar3,pnVar4,pcVar7,(ulong)uVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void add_objunit(struct GlobalVars *gv,struct ObjectUnit *ou,bool fixrelocs)
/* adds an ObjectUnit to the approriate list */
{
  if (ou) {
    uint8_t t = ou->lnkfile->type;

    if (t==ID_LIBARCH && gv->whole_archive)
      t = ID_OBJECT;  /* force linking of a whole archive */

    switch (t) {
      case ID_OBJECT:
      case ID_EXECUTABLE:
        ou->flags |= OUF_LINKED;  /* objects are always linked */
        addtail(&gv->selobjects,&ou->n);
        break;
      case ID_LIBARCH:
        addtail(&gv->libobjects,&ou->n);
        break;
      case ID_SHAREDOBJ:
        addtail(&gv->sharedobjects,&ou->n);
        break;
      default:
        ierror("add_objunit(): Link File type = %d",
               (int)ou->lnkfile->type);
    }

    if (fixrelocs) {  /* convert section index into address */
      struct Section *sec;
      struct Reloc *r;
      uint32_t idx;

      for (sec=(struct Section *)ou->sections.first;
           sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
        for (r=(struct Reloc *)sec->relocs.first;
             r->n.next!=NULL; r=(struct Reloc *)r->n.next) {
          idx = r->relocsect.id;
          if ((r->relocsect.ptr = find_sect_id(ou,idx)) == NULL) {
            /* section with this index doesn't exist */
            error(52,ou->lnkfile->pathname,sec->name,getobjname(ou),(int)idx);
          }
        }
      }
    }
  }
}